

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::
Holder(Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry> *this)

{
  Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry> *in_RDI;
  char newValue;
  
  pointer(in_RDI);
  newValue = (char)((ulong)in_RDI >> 0x38);
  anon_unknown.dwarf_643d2e::anon_unknown_0::Q_QGS_customTypeRegistry::innerFunction
            ((void *)0x3a5866);
  QBasicAtomicInteger<signed_char>::storeRelaxed
            ((QBasicAtomicInteger<signed_char> *)&this->storage,newValue);
  return;
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }